

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

size_t __thiscall CTxMemPool::DynamicMemoryUsage(CTxMemPool *this)

{
  pointer psVar1;
  size_t sVar2;
  pointer psVar3;
  size_t sVar4;
  size_type sVar5;
  uint64_t uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  psVar1 = (this->txns_randomized).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar2 = (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_node_count;
  psVar3 = (this->txns_randomized).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar7 = 0;
  if (psVar1 != psVar3) {
    uVar7 = (long)psVar1 + (0x1f - (long)psVar3) & 0xfffffffffffffff0;
  }
  sVar5 = (this->mapTx).node_count;
  uVar6 = this->cachedInnerUsage;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar4 * 0x60 + sVar2 * 0x40 + sVar5 * 0x1a0 + uVar6 + uVar7;
  }
  __stack_chk_fail();
}

Assistant:

size_t CTxMemPool::DynamicMemoryUsage() const {
    LOCK(cs);
    // Estimate the overhead of mapTx to be 15 pointers + an allocation, as no exact formula for boost::multi_index_contained is implemented.
    return memusage::MallocUsage(sizeof(CTxMemPoolEntry) + 15 * sizeof(void*)) * mapTx.size() + memusage::DynamicUsage(mapNextTx) + memusage::DynamicUsage(mapDeltas) + memusage::DynamicUsage(txns_randomized) + cachedInnerUsage;
}